

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O1

Expression *
slang::ast::UnaryExpression::fromSyntax
          (Compilation *compilation,PostfixUnaryExpressionSyntax *syntax,ASTContext *context)

{
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> *psVar1;
  ExpressionSyntax *syntax_00;
  Type *args_1;
  ulong uVar2;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_01;
  bool bVar3;
  Expression *pEVar4;
  UnaryExpression *expr;
  SourceLocation SVar5;
  Diagnostic *diag;
  char *func;
  SourceRange sourceRange;
  UnaryOperator local_44;
  SourceRange local_40;
  
  syntax_00 = (syntax->operand).ptr;
  if (syntax_00 == (ExpressionSyntax *)0x0) {
    func = 
    "T slang::not_null<slang::syntax::ExpressionSyntax *>::get() const [T = slang::syntax::ExpressionSyntax *]"
    ;
  }
  else {
    pEVar4 = Expression::create(compilation,syntax_00,context,
                                (bitmask<slang::ast::ASTFlags>)0x400000,(Type *)0x0);
    args_1 = (pEVar4->type).ptr;
    if (args_1 != (Type *)0x0) {
      local_44 = Expression::getUnaryOperator
                           ((syntax->super_ExpressionSyntax).super_SyntaxNode.kind);
      local_40 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
      expr = BumpAllocator::
             emplace<slang::ast::UnaryExpression,slang::ast::UnaryOperator,slang::ast::Type_const&,slang::ast::Expression&,slang::SourceRange>
                       (&compilation->super_BumpAllocator,&local_44,args_1,pEVar4,&local_40);
      bVar3 = Expression::bad(pEVar4);
      if (!bVar3) {
        SVar5 = parsing::Token::location(&syntax->operatorToken);
        bVar3 = Expression::requireLValue
                          (pEVar4,context,SVar5,(bitmask<slang::ast::AssignFlags>)0x0,
                           (Expression *)0x0,(EvalContext *)0x0);
        if (bVar3) {
          uVar2 = (context->flags).m_bits;
          if (((uint)uVar2 & 0xa0) == 0x80 || (uVar2 & 0x40) != 0) {
            sourceRange = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
            ASTContext::addDiag(context,(DiagCode)0x500007,sourceRange);
          }
          else {
            bVar3 = Type::isNumeric(args_1);
            if (bVar3) {
              psVar1 = &(syntax->attributes).
                        super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>
              ;
              syntax_01.data_ = psVar1->data_;
              syntax_01.size_ = psVar1->size_;
              if ((syntax->attributes).
                  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_
                  == 0 || psVar1->data_ != (pointer)0x0) {
                ASTContext::setAttributes(context,&expr->super_Expression,syntax_01);
                return &expr->super_Expression;
              }
              std::terminate();
            }
            SVar5 = parsing::Token::location(&syntax->operatorToken);
            diag = ASTContext::addDiag(context,(DiagCode)0x310007,SVar5);
            ast::operator<<(diag,args_1);
            Diagnostic::operator<<(diag,pEVar4->sourceRange);
          }
        }
      }
      pEVar4 = Expression::badExpr(compilation,&expr->super_Expression);
      return pEVar4;
    }
    func = "T slang::not_null<const slang::ast::Type *>::get() const [T = const slang::ast::Type *]"
    ;
  }
  assert::assertFailed
            ("ptr",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
             ,0x26,func);
}

Assistant:

Expression& UnaryExpression::fromSyntax(Compilation& compilation,
                                        const PostfixUnaryExpressionSyntax& syntax,
                                        const ASTContext& context) {
    // This method is only ever called for postincrement and postdecrement operators, so
    // the operand must be an lvalue.
    Expression& operand = create(compilation, *syntax.operand, context, ASTFlags::LValue);
    const Type* type = operand.type;

    Expression* result = compilation.emplace<UnaryExpression>(getUnaryOperator(syntax.kind), *type,
                                                              operand, syntax.sourceRange());
    if (operand.bad() || !operand.requireLValue(context, syntax.operatorToken.location()))
        return badExpr(compilation, result);

    if ((context.flags.has(ASTFlags::NonProcedural) &&
         !context.flags.has(ASTFlags::AssignmentAllowed)) ||
        context.flags.has(ASTFlags::AssignmentDisallowed)) {
        context.addDiag(diag::IncDecNotAllowed, syntax.sourceRange());
        return badExpr(compilation, result);
    }

    if (!type->isNumeric()) {
        auto& diag = context.addDiag(diag::BadUnaryExpression, syntax.operatorToken.location());
        diag << *type;
        diag << operand.sourceRange;
        return badExpr(compilation, result);
    }

    context.setAttributes(*result, syntax.attributes);
    return *result;
}